

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings.cpp
# Opt level: O3

void __thiscall
CBlockHeaderAndShortTxIDs::CBlockHeaderAndShortTxIDs
          (CBlockHeaderAndShortTxIDs *this,CBlock *block,uint64_t nonce)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  pointer pPVar7;
  pointer psVar8;
  uint64_t uVar9;
  CTransaction *__tmp;
  long lVar10;
  CBlock *pCVar11;
  CBlockHeader *pCVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  byte bVar14;
  allocator_type local_39;
  long local_38;
  
  bVar14 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->nonce = nonce;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->shorttxids,
             ((long)(block->vtx).
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(block->vtx).
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) - 1,&local_39);
  (this->prefilledtxn).
  super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->prefilledtxn).
  super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->prefilledtxn).
  super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar7 = (pointer)operator_new(0x18);
  (this->prefilledtxn).
  super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
  super__Vector_impl_data._M_start = pPVar7;
  (this->prefilledtxn).
  super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pPVar7 + 1;
  *(undefined8 *)pPVar7 = 0;
  (pPVar7->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar7->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->prefilledtxn).
  super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
  super__Vector_impl_data._M_finish = pPVar7 + 1;
  pCVar11 = block;
  pCVar12 = &this->header;
  for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
    uVar3 = (pCVar11->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0];
    uVar4 = (pCVar11->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1];
    uVar5 = (pCVar11->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2];
    uVar6 = (pCVar11->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3];
    pCVar12->nVersion = (pCVar11->super_CBlockHeader).nVersion;
    (pCVar12->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0] = uVar3;
    (pCVar12->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[1] = uVar4;
    (pCVar12->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[2] = uVar5;
    (pCVar12->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[3] = uVar6;
    pCVar11 = (CBlock *)((long)pCVar11 + (ulong)bVar14 * -0x10 + 8);
    pCVar12 = (CBlockHeader *)((long)pCVar12 + (ulong)bVar14 * -0x10 + 8);
  }
  FillShortTxIDSelector(this);
  psVar8 = (block->vtx).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar1 = (psVar8->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (psVar8->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  pPVar7 = (this->prefilledtxn).
           super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar7->index = 0;
  (pPVar7->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  this_00 = (pPVar7->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (pPVar7->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  psVar8 = (block->vtx).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0x10 < (ulong)((long)(block->vtx).
                           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)psVar8)) {
    uVar13 = 1;
    lVar10 = 0x10;
    do {
      uVar9 = SipHashUint256(this->shorttxidk0,this->shorttxidk1,
                             (uint256 *)
                             (*(long *)((long)&(psVar8->
                                               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                               )._M_ptr + lVar10) + 0x59));
      (this->shorttxids).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar13 - 1] = uVar9 & 0xffffffffffff;
      uVar13 = uVar13 + 1;
      psVar8 = (block->vtx).
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar10 = lVar10 + 0x10;
    } while (uVar13 < (ulong)((long)(block->vtx).
                                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar8 >> 4))
    ;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CBlockHeaderAndShortTxIDs::CBlockHeaderAndShortTxIDs(const CBlock& block, const uint64_t nonce) :
        nonce(nonce),
        shorttxids(block.vtx.size() - 1), prefilledtxn(1), header(block) {
    FillShortTxIDSelector();
    //TODO: Use our mempool prior to block acceptance to predictively fill more than just the coinbase
    prefilledtxn[0] = {0, block.vtx[0]};
    for (size_t i = 1; i < block.vtx.size(); i++) {
        const CTransaction& tx = *block.vtx[i];
        shorttxids[i - 1] = GetShortID(tx.GetWitnessHash());
    }
}